

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O3

BndryRegister * __thiscall
amrex::BndryRegister::linComb
          (BndryRegister *this,Real a,MultiFab *mfa,int a_comp,Real b,MultiFab *mfb,int b_comp,
          int dest_comp,int num_comp,int n_ghost)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    FabSet::linComb((FabSet *)((long)this->bndry + lVar1 + -8),a,mfa,a_comp,b,mfb,b_comp,dest_comp,
                    num_comp,n_ghost);
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x908);
  return this;
}

Assistant:

BndryRegister&
BndryRegister::linComb (Real            a,
                        const MultiFab& mfa,
                        int             a_comp,
                        Real            b,
                        const MultiFab& mfb,
                        int             b_comp,
                        int             dest_comp,
                        int             num_comp,
                        int             n_ghost)
{
    for (OrientationIter face; face; ++face)
    {
        bndry[face()].linComb(a,
                              mfa,
                              a_comp,
                              b,
                              mfb,
                              b_comp,
                              dest_comp,
                              num_comp,
                              n_ghost);
    }
    return *this;
}